

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

bool __thiscall FPolyObj::RotatePolyobj(FPolyObj *this,DAngle *angle,bool fromsave)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double __x;
  double dVar5;
  vertex_t *pvVar6;
  FPolyVertex *pFVar7;
  vertex_t **ppvVar8;
  undefined8 *puVar9;
  double __x_00;
  double dVar10;
  undefined8 uVar11;
  FBoundingBox bounds;
  bool bVar12;
  ulong uVar13;
  FPolyObj *this_00;
  bool bVar14;
  long lVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar19 = (this->Bounds).m_Box[0];
  dVar20 = (this->Bounds).m_Box[1];
  dVar18 = (this->Bounds).m_Box[2];
  dVar3 = (this->Bounds).m_Box[3];
  UnLinkPolyobj(this);
  if ((this->Vertices).Count != 0) {
    lVar15 = 1;
    uVar13 = 0;
    do {
      pvVar6 = (this->Vertices).Array[uVar13];
      dVar4 = (pvVar6->p).Y;
      pdVar2 = (double *)((long)(this->PrevPts).Array + lVar15 * 8 + -8);
      *pdVar2 = (pvVar6->p).X;
      pdVar2[1] = dVar4;
      pFVar7 = (this->OriginalPts).Array;
      dVar4 = *(double *)((long)pFVar7 + lVar15 * 8 + -8);
      __x = (&(pFVar7->pos).X)[lVar15];
      __x_00 = FFastTrig::sin(&fasttrig,__x);
      dVar10 = FFastTrig::cos(&fasttrig,__x_00);
      dVar5 = (this->StartSpot).pos.Y;
      pvVar6 = (this->Vertices).Array[uVar13];
      (pvVar6->p).X = (dVar4 * dVar10 - __x * __x_00) + (this->StartSpot).pos.X;
      (pvVar6->p).Y = __x * dVar10 + dVar4 * __x_00 + dVar5;
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 2;
    } while (uVar13 < (this->Vertices).Count);
  }
  this->validcount = this->validcount + 1;
  UpdateBBox(this);
  if ((!fromsave) && ((this->Sidedefs).Count != 0)) {
    uVar13 = 0;
    bVar14 = false;
    do {
      bVar12 = CheckMobjBlocking(this,(this->Sidedefs).Array[uVar13]);
      if (bVar12) {
        bVar14 = true;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (this->Sidedefs).Count);
    if (bVar14) {
      uVar13 = (ulong)(this->Vertices).Count;
      if (uVar13 != 0) {
        ppvVar8 = (this->Vertices).Array;
        pFVar7 = (this->PrevPts).Array;
        lVar15 = 0;
        do {
          puVar9 = *(undefined8 **)((long)ppvVar8 + lVar15);
          puVar1 = (undefined8 *)((long)&(pFVar7->pos).X + lVar15 * 2);
          uVar11 = puVar1[1];
          *puVar9 = *puVar1;
          puVar9[1] = uVar11;
          lVar15 = lVar15 + 8;
        } while (uVar13 << 3 != lVar15);
      }
      UpdateBBox(this);
      LinkPolyobj(this);
      return false;
    }
  }
  (this->Angle).Degrees = angle->Degrees + (this->Angle).Degrees;
  LinkPolyobj(this);
  this_00 = this;
  ClearSubsectorLinks(this);
  dVar4 = (this->Bounds).m_Box[2];
  uVar16 = SUB84(dVar4,0);
  uVar17 = (undefined4)((ulong)dVar4 >> 0x20);
  if (dVar18 <= dVar4) {
    uVar16 = SUB84(dVar18,0);
    uVar17 = (undefined4)((ulong)dVar18 >> 0x20);
  }
  dVar18 = (this->Bounds).m_Box[0];
  if (dVar18 <= dVar19) {
    dVar18 = dVar19;
  }
  dVar19 = (this->Bounds).m_Box[1];
  if (dVar20 <= dVar19) {
    dVar19 = dVar20;
  }
  dVar20 = (this->Bounds).m_Box[3];
  if (dVar20 <= dVar3) {
    dVar20 = dVar3;
  }
  bounds.m_Box[2]._4_4_ = uVar17;
  bounds.m_Box[2]._0_4_ = uVar16;
  bounds.m_Box[1] = dVar19;
  bounds.m_Box[0] = dVar18;
  bounds.m_Box[3] = dVar20;
  RecalcActorFloorCeil(this_00,bounds);
  return true;
}

Assistant:

bool FPolyObj::RotatePolyobj (DAngle angle, bool fromsave)
{
	DAngle an;
	bool blocked;
	FBoundingBox oldbounds = Bounds;

	an = Angle + angle;

	UnLinkPolyobj();

	for(unsigned i=0;i < Vertices.Size(); i++)
	{
		PrevPts[i].pos = Vertices[i]->fPos();
		FPolyVertex torot = OriginalPts[i];
		RotatePt(an, torot.pos, StartSpot.pos);
		Vertices[i]->set(torot.pos.X, torot.pos.Y);
	}
	blocked = false;
	validcount++;
	UpdateBBox();

	// If we are loading a savegame we do not really want to damage actors and be blocked by them. This can also cause crashes when trying to damage incompletely deserialized player pawns.
	if (!fromsave)
	{
		for (unsigned i = 0; i < Sidedefs.Size(); i++)
		{
			if (CheckMobjBlocking(Sidedefs[i]))
			{
				blocked = true;
			}
		}
		if (blocked)
		{
			for(unsigned i=0;i < Vertices.Size(); i++)
			{
				Vertices[i]->set(PrevPts[i].pos.X, PrevPts[i].pos.Y);
			}
			UpdateBBox();
			LinkPolyobj();
			return false;
		}
	}
	Angle += angle;
	LinkPolyobj();
	ClearSubsectorLinks();
	RecalcActorFloorCeil(Bounds | oldbounds);
	return true;
}